

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDDD.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChNodeFEAxyzDDD::NodeIntStateGather
          (ChNodeFEAxyzDDD *this,uint off_x,ChState *x,uint off_v,ChStateDelta *v,double *T)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  Index index;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  lVar3 = (x->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < (long)(ulong)off_x) goto LAB_00656172;
  pdVar2 = (x->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar4 = 3;
  pdVar1 = pdVar2 + off_x;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00655e3d;
  }
  else {
LAB_00655e3d:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           *(double *)
            (&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
              super_ChNodeFEAbase.field_0x20 + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           *(double *)
            (&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.
              super_ChNodeFEAbase.field_0x20 + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_x + 3)) goto LAB_00656172;
  pdVar1 = pdVar2 + (off_x + 3);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00655ea9;
  }
  else {
LAB_00655ea9:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           *(double *)
            ((long)(&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt + -1) + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           *(double *)
            ((long)(&(this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt + -1) + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_x + 6)) goto LAB_00656172;
  pdVar1 = pdVar2 + (off_x + 6);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00655f1b;
  }
  else {
LAB_00655f1b:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = *(double *)((long)(&(this->super_ChNodeFEAxyzDD).DD_dt + -1) + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = *(double *)((long)(&(this->super_ChNodeFEAxyzDD).DD_dt + -1) + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_x + 9)) goto LAB_00656172;
  pdVar2 = pdVar2 + (off_x + 9);
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00655f84;
  }
  else {
LAB_00655f84:
    uVar6 = 0;
    do {
      pdVar2[uVar6] = *(double *)((long)(&this->DDD_dt + -1) + uVar6 * 8);
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = *(double *)((long)(&this->DDD_dt + -1) + uVar4 * 8);
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  lVar3 = (v->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3;
  if (lVar3 < (long)(ulong)off_v) goto LAB_00656172;
  pdVar2 = (v->super_ChVectorDynamic<double>).
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  uVar4 = 3;
  pdVar1 = pdVar2 + off_v;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00655ffa;
  }
  else {
LAB_00655ffa:
    uVar6 = 0;
    do {
      pdVar1[uVar6] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar6 - 0x10];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] =
           (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.super_ChNodeFEAxyz.X0.m_data
           [uVar4 - 0x10];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_v + 3)) goto LAB_00656172;
  pdVar1 = pdVar2 + (off_v + 3);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_00656065;
  }
  else {
LAB_00656065:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).super_ChNodeFEAxyzD.D_dt.m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_v + 6)) goto LAB_00656172;
  pdVar1 = pdVar2 + (off_v + 6);
  uVar4 = 3;
  if (((ulong)pdVar1 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 != 0) goto LAB_006560d6;
  }
  else {
LAB_006560d6:
    uVar6 = 0;
    do {
      pdVar1[uVar6] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar6];
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (uVar4 < 3) {
    do {
      pdVar1[uVar4] = (this->super_ChNodeFEAxyzDD).DD_dt.m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  if (lVar3 < (long)(ulong)(off_v + 9)) {
LAB_00656172:
    __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                  ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                  "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                 );
  }
  pdVar2 = pdVar2 + (off_v + 9);
  uVar4 = 3;
  if (((ulong)pdVar2 & 7) == 0) {
    uVar5 = -((uint)((ulong)pdVar2 >> 3) & 0x1fffffff) & 7;
    if ((ulong)uVar5 < 3) {
      uVar4 = (ulong)uVar5;
    }
    if (uVar5 == 0) goto LAB_00656153;
  }
  uVar6 = 0;
  do {
    pdVar2[uVar6] = (this->DDD_dt).m_data[uVar6];
    uVar6 = uVar6 + 1;
  } while (uVar4 != uVar6);
LAB_00656153:
  if (uVar4 < 3) {
    do {
      pdVar2[uVar4] = (this->DDD_dt).m_data[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar4 != 3);
  }
  return;
}

Assistant:

void ChNodeFEAxyzDDD::NodeIntStateGather(const unsigned int off_x,
                                        ChState& x,
                                        const unsigned int off_v,
                                        ChStateDelta& v,
                                        double& T) {
    x.segment(off_x + 0, 3) = pos.eigen();
    x.segment(off_x + 3, 3) = D.eigen();
    x.segment(off_x + 6, 3) = DD.eigen();
	x.segment(off_x + 9, 3) = DDD.eigen();

    v.segment(off_v + 0, 3) = pos_dt.eigen();
    v.segment(off_v + 3, 3) = D_dt.eigen();
    v.segment(off_v + 6, 3) = DD_dt.eigen();
	v.segment(off_v + 9, 3) = DDD_dt.eigen();
}